

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O2

void Gli_ManFinalize(Gli_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = p->iObjData;
  if (iVar5 != p->nObjData) {
    __assert_fail("p->iObjData == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                  ,0xe1,"void Gli_ManFinalize(Gli_Man_t *)");
  }
  uVar4 = 0;
  while( true ) {
    if ((iVar5 <= (int)uVar4) || (piVar3 = p->pObjData, piVar3 == (int *)0x0)) {
      return;
    }
    uVar1 = piVar3[(ulong)uVar4 + 5];
    if (uVar1 != ((uint)piVar3[uVar4] >> 4 & 7)) {
      __assert_fail("pObj->iFanin == (int)pObj->nFanins",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                    ,0xe4,"void Gli_ManFinalize(Gli_Man_t *)");
    }
    uVar2 = piVar3[(ulong)uVar4 + 6];
    if (uVar2 != (uint)piVar3[uVar4] >> 7) break;
    (piVar3 + (ulong)uVar4 + 5)[0] = 0;
    (piVar3 + (ulong)uVar4 + 5)[1] = 0;
    uVar4 = uVar4 + uVar2 + uVar1 + 8;
    iVar5 = p->nObjData;
  }
  __assert_fail("pObj->iFanout == (int)pObj->nFanouts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                ,0xe5,"void Gli_ManFinalize(Gli_Man_t *)");
}

Assistant:

void Gli_ManFinalize( Gli_Man_t * p )
{
    Gli_Obj_t * pObj;
    int i;
    assert( p->iObjData == p->nObjData );
    Gli_ManForEachObj( p, pObj, i )
    {
        assert( pObj->iFanin == (int)pObj->nFanins );
        assert( pObj->iFanout == (int)pObj->nFanouts );
        pObj->iFanin = 0;
        pObj->iFanout = 0;
    }
}